

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-save.c
# Opt level: O0

ztresult_t savehandler_startstruct(char *name,void *opaque)

{
  int iVar1;
  savestate_t *in_RSI;
  undefined8 in_RDI;
  bool bVar2;
  savestack_entry_t entry;
  int isarray;
  savestack_entry_t *scope;
  savestate_t *state;
  ztresult_t rc;
  save_stack_t *in_stack_ffffffffffffffb8;
  savestack_entry_t *entry_00;
  ztresult_t local_4;
  
  entry_00 = (savestack_entry_t *)0x0;
  bVar2 = false;
  iVar1 = savestack_empty((save_stack_t *)0x103ae7);
  if (iVar1 == 0) {
    entry_00 = savestack_top(in_stack_ffffffffffffffb8);
    bVar2 = entry_00->container == Array;
  }
  local_4 = savestack_push((save_stack_t *)in_RSI,entry_00);
  if (local_4 == 0) {
    if (bVar2) {
      entry_00->index = entry_00->index + 1;
      emitf(in_RSI,"{\n");
    }
    else {
      emitf(in_RSI,"%s = {\n",in_RDI);
    }
    indent(in_RSI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static ztresult_t savehandler_startstruct(const char *name, void *opaque)
{
  ztresult_t         rc;
  savestate_t       *state   = opaque;
  savestack_entry_t *scope   = NULL;
  int                isarray = 0;
  savestack_entry_t  entry;

  if (!savestack_empty(&state->stack))
  {
    scope   = savestack_top(&state->stack);
    isarray = (scope->container == Array);
  }

  entry.container = Struct;
  entry.nelems    = -1;
  entry.index     = 0;
  rc = savestack_push(&state->stack, &entry);
  if (rc)
    return rc;

  if (isarray)
  {
    scope->index++;
    emitf(state, "{\n");
  }
  else
  {
    emitf(state, "%s = {\n", name);
  }

  indent(state);

  return ztresult_OK;
}